

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ParenthesizedEventExpressionSyntax::setChild
          (ParenthesizedEventExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->closeParen).kind = TVar2.kind;
    (this->closeParen).field_0x2 = TVar2._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->closeParen).rawLen = TVar2.rawLen;
    (this->closeParen).info = TVar2.info;
  }
  else if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (EventExpressionSyntax *)pSVar1;
  }
  else {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->openParen).kind = TVar2.kind;
    (this->openParen).field_0x2 = TVar2._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->openParen).rawLen = TVar2.rawLen;
    (this->openParen).info = TVar2.info;
  }
  return;
}

Assistant:

void ParenthesizedEventExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<EventExpressionSyntax>() : nullptr; return;
        case 2: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}